

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O3

void __thiscall
PathTracer::create_target_images
          (PathTracer *this,shared_ptr<myvk::Device> *device,
          vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
          *access_queue)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 local_48 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_48._24_8_ = *(undefined8 *)&this->m_width;
  myvk::Image::CreateTexture2D
            ((Image *)local_48,device,(VkExtent2D *)(local_48 + 0x18),1,
             VK_FORMAT_R32G32B32A32_SFLOAT,0xb,access_queue);
  uVar3 = local_48._8_8_;
  uVar2 = local_48._0_8_;
  local_48._0_8_ = (element_type *)0x0;
  local_48._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((element_type *)local_48._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  local_48._24_8_ = *(undefined8 *)&this->m_width;
  myvk::Image::CreateTexture2D
            ((Image *)local_48,device,(VkExtent2D *)(local_48 + 0x18),1,VK_FORMAT_R8G8B8A8_UNORM,0xb
             ,access_queue);
  uVar3 = local_48._8_8_;
  uVar2 = local_48._0_8_;
  local_48._0_8_ = (element_type *)0x0;
  local_48._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_albedo_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_albedo_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->m_albedo_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((element_type *)local_48._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  local_48._24_8_ = *(undefined8 *)&this->m_width;
  myvk::Image::CreateTexture2D
            ((Image *)local_48,device,(VkExtent2D *)(local_48 + 0x18),1,VK_FORMAT_R8G8B8A8_SNORM,0xb
             ,access_queue);
  uVar3 = local_48._8_8_;
  uVar2 = local_48._0_8_;
  local_48._0_8_ = (element_type *)0x0;
  local_48._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_normal_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_normal_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->m_normal_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((element_type *)local_48._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  local_48._24_8_ =
       (this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28._M_pi =
       (this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
    }
  }
  myvk::ImageView::Create
            ((ImageView *)local_48,(Ptr<ImageBase> *)(local_48 + 0x18),VK_IMAGE_VIEW_TYPE_2D,1);
  uVar3 = local_48._8_8_;
  uVar2 = local_48._0_8_;
  local_48._0_8_ = (element_type *)0x0;
  local_48._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_color_image_view).
           super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_color_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)uVar2;
  (this->m_color_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((element_type *)local_48._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  local_48._24_8_ =
       (this->m_albedo_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28._M_pi =
       (this->m_albedo_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
    }
  }
  myvk::ImageView::Create
            ((ImageView *)local_48,(Ptr<ImageBase> *)(local_48 + 0x18),VK_IMAGE_VIEW_TYPE_2D,1);
  uVar3 = local_48._8_8_;
  uVar2 = local_48._0_8_;
  local_48._0_8_ = (element_type *)0x0;
  local_48._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_albedo_image_view).
           super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_albedo_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)uVar2;
  (this->m_albedo_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((element_type *)local_48._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  local_48._24_8_ =
       (this->m_normal_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28._M_pi =
       (this->m_normal_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_pi)->_M_use_count = (local_28._M_pi)->_M_use_count + 1;
    }
  }
  myvk::ImageView::Create
            ((ImageView *)local_48,(Ptr<ImageBase> *)(local_48 + 0x18),VK_IMAGE_VIEW_TYPE_2D,1);
  uVar3 = local_48._8_8_;
  uVar2 = local_48._0_8_;
  local_48._0_8_ = (_func_int **)0x0;
  local_48._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_normal_image_view).
           super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_normal_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)uVar2;
  (this->m_normal_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((element_type *)local_48._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  return;
}

Assistant:

void PathTracer::create_target_images(const std::shared_ptr<myvk::Device> &device,
                                      const std::vector<std::shared_ptr<myvk::Queue>> &access_queue) {
	m_color_image = myvk::Image::CreateTexture2D(
	    device, {m_width, m_height}, 1, VK_FORMAT_R32G32B32A32_SFLOAT,
	    VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT, access_queue);
	m_albedo_image = myvk::Image::CreateTexture2D(
	    device, {m_width, m_height}, 1, VK_FORMAT_R8G8B8A8_UNORM,
	    VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT, access_queue);
	m_normal_image = myvk::Image::CreateTexture2D(
	    device, {m_width, m_height}, 1, VK_FORMAT_R8G8B8A8_SNORM,
	    VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT, access_queue);

	m_color_image_view = myvk::ImageView::Create(m_color_image, VK_IMAGE_VIEW_TYPE_2D);
	m_albedo_image_view = myvk::ImageView::Create(m_albedo_image, VK_IMAGE_VIEW_TYPE_2D);
	m_normal_image_view = myvk::ImageView::Create(m_normal_image, VK_IMAGE_VIEW_TYPE_2D);
}